

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O3

int ixmlNode_setNodeName(IXML_Node *node,char *qualifiedName)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  
  if (node != (IXML_Node *)0x0) {
    if (node->nodeName != (char *)0x0) {
      free(node->nodeName);
      node->nodeName = (char *)0x0;
    }
    iVar3 = 0;
    if (qualifiedName != (char *)0x0) {
      pcVar2 = strdup(qualifiedName);
      node->nodeName = pcVar2;
      if (pcVar2 == (char *)0x0) {
        iVar3 = 0x66;
      }
      else {
        iVar1 = Parser_setNodePrefixAndLocalName(node);
        iVar3 = 0;
        if (iVar1 != 0) {
          free(node->nodeName);
          iVar3 = iVar1;
        }
      }
    }
    return iVar3;
  }
  __assert_fail("node != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/pupnp[P]pupnp/ixml/src/node.c",
                0x551,"int ixmlNode_setNodeName(IXML_Node *, const char *)");
}

Assistant:

int ixmlNode_setNodeName(IXML_Node *node, const DOMString qualifiedName)
{
	int rc = IXML_SUCCESS;

	assert(node != NULL);

	if (node->nodeName != NULL) {
		free(node->nodeName);
		node->nodeName = NULL;
	}

	if (qualifiedName != NULL) {
		/* set the name part */
		node->nodeName = strdup(qualifiedName);
		if (node->nodeName == NULL) {
			return IXML_INSUFFICIENT_MEMORY;
		}

		rc = Parser_setNodePrefixAndLocalName(node);
		if (rc != IXML_SUCCESS) {
			free(node->nodeName);
		}
	}

	return rc;
}